

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O2

void __thiscall
CEditor::DoQuadEnvelopes
          (CEditor *this,array<CQuad,_allocator_default<CQuad>_> *lQuads,CTextureHandle Texture)

{
  undefined4 uVar1;
  CPoint CVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  CEnvelope **ppCVar8;
  CEnvPoint *pCVar9;
  CQuad *pCVar10;
  void *block;
  long lVar11;
  int i;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  CEnvelope *pCVar15;
  int *piVar16;
  uint uVar17;
  int j_1;
  int n;
  int iVar18;
  long lVar19;
  int j;
  CPoint *pCVar20;
  long in_FS_OFFSET;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  int local_b8;
  int iStack_b4;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float aResults [4];
  
  lVar7 = *(long *)(in_FS_OFFSET + 0x28);
  uVar17 = lQuads->num_elements;
  uVar13 = 0xffffffffffffffff;
  if (-1 < (long)(int)uVar17) {
    uVar13 = (long)(int)uVar17 * 8;
  }
  block = operator_new__(uVar13);
  mem_zero(block,uVar17 * 8);
  iVar18 = this->m_ShowEnvelopePreview;
  uVar5 = this->m_SelectedEnvelope;
  iVar6 = (this->m_Map).m_lEnvelopes.num_elements;
  uVar13 = 0;
  uVar14 = 0;
  if (0 < (int)uVar17) {
    uVar14 = (ulong)uVar17;
  }
  ppCVar8 = (this->m_Map).m_lEnvelopes.list;
  piVar16 = &lQuads->list->m_PosEnv;
  do {
    if (uVar14 == uVar13) {
      (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x13])
                (this->m_pGraphics,0xffffffffffffffff);
      (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x14])();
      (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
                (0x3ea0a0a1,0x3f169697,0x3f66e6e7,0x3f000000);
      for (uVar13 = 0; uVar13 != uVar14; uVar13 = uVar13 + 1) {
        pCVar15 = *(CEnvelope **)((long)block + uVar13 * 8);
        if (pCVar15 != (CEnvelope *)0x0) {
          pCVar20 = lQuads->list[uVar13].m_aPoints + 4;
          for (lVar11 = 0; lVar11 < (long)(pCVar15->m_lPoints).num_elements + -1;
              lVar11 = lVar11 + 1) {
            CEnvelope::Eval(pCVar15,(float)(pCVar15->m_lPoints).list[lVar11].super_CEnvPoint_v1.
                                           m_Time / 1000.0 + 1e-06,aResults);
            CVar2 = *pCVar20;
            fVar24 = aResults[0] + (float)CVar2.x * 0.0009765625;
            fVar23 = aResults[1] + (float)CVar2.y * 0.0009765625;
            for (iVar18 = 1; iVar18 != 0x10; iVar18 = iVar18 + 1) {
              pCVar15 = *(CEnvelope **)((long)block + uVar13 * 8);
              pCVar9 = (pCVar15->m_lPoints).list;
              iVar6 = pCVar9[lVar11].super_CEnvPoint_v1.m_Time;
              CEnvelope::Eval(pCVar15,(float)(int)((float)(pCVar9[lVar11 + 1].super_CEnvPoint_v1.
                                                           m_Time - iVar6) * ((float)iVar18 / 15.0)
                                                  + (float)iVar6) / 1000.0 + -1e-06,aResults);
              CVar2 = *pCVar20;
              fVar21 = aResults[0] + (float)CVar2.x * 0.0009765625;
              fVar22 = aResults[1] + (float)CVar2.y * 0.0009765625;
              local_a8 = fVar24;
              fStack_a4 = fVar23;
              fStack_a0 = fVar21;
              fStack_9c = fVar22;
              (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x16])
                        (this->m_pGraphics,&local_a8,1);
              fVar24 = fVar21;
              fVar23 = fVar22;
            }
            pCVar15 = *(CEnvelope **)((long)block + uVar13 * 8);
          }
        }
      }
      (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
                (0x3f800000,0x3f800000,0x3f800000,0x3f800000);
      (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x15])();
      (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x13])
                (this->m_pGraphics,(ulong)(uint)Texture.m_Id);
      (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
      for (uVar13 = 0; uVar13 != uVar14; uVar13 = uVar13 + 1) {
        lVar11 = *(long *)((long)block + uVar13 * 8);
        if (lVar11 != 0) {
          pCVar20 = lQuads->list[uVar13].m_aPoints;
          lVar19 = 0x10;
          for (lVar12 = 0; lVar12 < *(int *)(lVar11 + 0x14); lVar12 = lVar12 + 1) {
            fVar24 = (((float)*(int *)(*(long *)(lVar11 + 8) + lVar19) * 0.0009765625) / 360.0) *
                     3.1415927;
            aResults[3] = (float)lQuads->list[uVar13].m_aColors[0].b;
            uVar3 = *(undefined8 *)(*(long *)(lVar11 + 8) + -8 + lVar19);
            aResults[0] = 0.0;
            pCVar10 = lQuads->list + uVar13;
            uVar1 = pCVar10->m_aColors[0].r;
            uVar4 = pCVar10->m_aColors[0].g;
            aResults[1] = (float)(int)uVar1;
            aResults[2] = (float)(int)uVar4;
            fVar24 = fVar24 + fVar24;
            (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x20])
                      (this->m_pGraphics,aResults,4);
            if ((fVar24 != 0.0) || (NAN(fVar24))) {
              DoQuadEnvelopes::aRotated[0] = lQuads->list[uVar13].m_aPoints[0];
              DoQuadEnvelopes::aRotated[1] = lQuads->list[uVar13].m_aPoints[1];
              DoQuadEnvelopes::aRotated[2] = lQuads->list[uVar13].m_aPoints[2];
              DoQuadEnvelopes::aRotated[3] = lQuads->list[uVar13].m_aPoints[3];
              pCVar20 = DoQuadEnvelopes::aRotated;
              Rotate(lQuads->list[uVar13].m_aPoints + 4,DoQuadEnvelopes::aRotated,fVar24);
              Rotate(lQuads->list[uVar13].m_aPoints + 4,DoQuadEnvelopes::aRotated + 1,fVar24);
              Rotate(lQuads->list[uVar13].m_aPoints + 4,DoQuadEnvelopes::aRotated + 2,fVar24);
              Rotate(lQuads->list[uVar13].m_aPoints + 4,DoQuadEnvelopes::aRotated + 3,fVar24);
            }
            local_b8 = (int)uVar3;
            iStack_b4 = (int)((ulong)uVar3 >> 0x20);
            pCVar10 = lQuads->list;
            fVar24 = (float)local_b8 * 0.0009765625;
            fVar23 = (float)iStack_b4 * 0.0009765625;
            fVar21 = (float)local_b8 * 0.0009765625;
            fVar22 = (float)iStack_b4 * 0.0009765625;
            (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1b])
                      ((float)pCVar10[uVar13].m_aTexcoords[0].x * 0.0009765625,
                       (float)pCVar10[uVar13].m_aTexcoords[0].y * 0.0009765625,
                       (float)pCVar10[uVar13].m_aTexcoords[1].x * 0.0009765625,
                       (float)pCVar10[uVar13].m_aTexcoords[1].y * 0.0009765625,
                       (float)pCVar10[uVar13].m_aTexcoords[2].x * 0.0009765625,
                       (float)pCVar10[uVar13].m_aTexcoords[2].y * 0.0009765625,
                       (float)pCVar10[uVar13].m_aTexcoords[3].x * 0.0009765625,
                       (float)pCVar10[uVar13].m_aTexcoords[3].y * 0.0009765625,this->m_pGraphics,
                       0xffffffffffffffff);
            local_a8 = (float)((CQuad *)pCVar20)->m_aPoints[0].x * 0.0009765625 + fVar24;
            fStack_a4 = (float)((CQuad *)pCVar20)->m_aPoints[0].y * 0.0009765625 + fVar23;
            fStack_a0 = (float)((CQuad *)pCVar20)->m_aPoints[1].x * 0.0009765625 + fVar21;
            fStack_9c = (float)((CQuad *)pCVar20)->m_aPoints[1].y * 0.0009765625 + fVar22;
            local_98 = (float)((CQuad *)pCVar20)->m_aPoints[2].x * 0.0009765625 + fVar24;
            fStack_94 = (float)((CQuad *)pCVar20)->m_aPoints[2].y * 0.0009765625 + fVar23;
            fStack_90 = (float)((CQuad *)pCVar20)->m_aPoints[3].x * 0.0009765625 + fVar21;
            fStack_8c = (float)((CQuad *)pCVar20)->m_aPoints[3].y * 0.0009765625 + fVar22;
            (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1e])
                      (this->m_pGraphics,&local_a8,1);
            lVar11 = *(long *)((long)block + uVar13 * 8);
            lVar19 = lVar19 + 0x58;
          }
        }
      }
      (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
      (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x13])
                (this->m_pGraphics,0xffffffffffffffff);
      (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
      for (uVar13 = 0; uVar13 != uVar14; uVar13 = uVar13 + 1) {
        lVar11 = *(long *)((long)block + uVar13 * 8);
        if (lVar11 != 0) {
          for (iVar18 = 0; iVar18 < *(int *)(lVar11 + 0x14); iVar18 = iVar18 + 1) {
            DoQuadEnvPoint(this,lQuads->list + uVar13,(int)uVar13,iVar18);
            lVar11 = *(long *)((long)block + uVar13 * 8);
          }
        }
      }
      (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
      operator_delete__(block);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar7) {
        return;
      }
      __stack_chk_fail();
    }
    if (iVar18 == 1) {
      uVar17 = uVar5;
      if (*piVar16 == uVar5) goto LAB_00188c33;
    }
    else if (iVar18 == 2) {
      uVar17 = *piVar16;
LAB_00188c33:
      if ((-1 < (int)uVar17) && ((int)uVar17 < iVar6)) {
        *(CEnvelope **)((long)block + uVar13 * 8) = ppCVar8[uVar17];
      }
    }
    uVar13 = uVar13 + 1;
    piVar16 = piVar16 + 0x26;
  } while( true );
}

Assistant:

void CEditor::DoQuadEnvelopes(const array<CQuad> &lQuads, IGraphics::CTextureHandle Texture)
{
	int Num = lQuads.size();
	CEnvelope **apEnvelope = new CEnvelope*[Num];
	mem_zero(apEnvelope, sizeof(CEnvelope*)*Num);
	for(int i = 0; i < Num; i++)
	{
		if((m_ShowEnvelopePreview == SHOWENV_SELECTED && lQuads[i].m_PosEnv == m_SelectedEnvelope) || m_ShowEnvelopePreview == SHOWENV_ALL)
			if(lQuads[i].m_PosEnv >= 0 && lQuads[i].m_PosEnv < m_Map.m_lEnvelopes.size())
				apEnvelope[i] = m_Map.m_lEnvelopes[lQuads[i].m_PosEnv];
	}

	//Draw Lines
	Graphics()->TextureClear();
	Graphics()->LinesBegin();
	Graphics()->SetColor(80.0f/255, 150.0f/255, 230.f/255, 0.5f);
	for(int j = 0; j < Num; j++)
	{
		if(!apEnvelope[j])
			continue;

		//QuadParams
		const CPoint *pPoints = lQuads[j].m_aPoints;
		for(int i = 0; i < apEnvelope[j]->m_lPoints.size()-1; i++)
		{
			float aResults[4];
			vec2 Pos0 = vec2(0,0);

			apEnvelope[j]->Eval(apEnvelope[j]->m_lPoints[i].m_Time/1000.0f + 0.000001f, aResults);
			Pos0 = vec2(fx2f(pPoints[4].x)+aResults[0], fx2f(pPoints[4].y)+aResults[1]);

			const int Steps = 15;
			for(int n = 1; n <= Steps; n++)
			{
				float a = n/(float)Steps;

				// little offset to prevent looping due to fmod
				float time = mix(apEnvelope[j]->m_lPoints[i].m_Time, apEnvelope[j]->m_lPoints[i+1].m_Time, a);
				apEnvelope[j]->Eval(time/1000.0f - 0.000001f, aResults);

				vec2 Pos1 = vec2(fx2f(pPoints[4].x)+aResults[0], fx2f(pPoints[4].y)+aResults[1]);

				IGraphics::CLineItem Line = IGraphics::CLineItem(Pos0.x, Pos0.y, Pos1.x, Pos1.y);
				Graphics()->LinesDraw(&Line, 1);

				Pos0 = Pos1;
			}
		}
	}
	Graphics()->SetColor(1.0f, 1.0f, 1.0f, 1.0f);
	Graphics()->LinesEnd();

	//Draw Quads
	Graphics()->TextureSet(Texture);
	Graphics()->QuadsBegin();

	for(int j = 0; j < Num; j++)
	{
		if(!apEnvelope[j])
			continue;

		//QuadParams
		const CPoint *pPoints = lQuads[j].m_aPoints;

		for(int i = 0; i < apEnvelope[j]->m_lPoints.size(); i++)
		{
			//Calc Env Position
			float OffsetX = fx2f(apEnvelope[j]->m_lPoints[i].m_aValues[0]);
			float OffsetY = fx2f(apEnvelope[j]->m_lPoints[i].m_aValues[1]);
			float Rot = fx2f(apEnvelope[j]->m_lPoints[i].m_aValues[2])/360.0f*pi*2;

			//Set Colors
			float Alpha = (m_SelectedQuadEnvelope == lQuads[j].m_PosEnv && m_SelectedEnvelopePoint == i) ? 0.65f : 0.35f;
			IGraphics::CColorVertex aArray[4] = {
				IGraphics::CColorVertex(0, lQuads[j].m_aColors[0].r, lQuads[j].m_aColors[0].g, lQuads[j].m_aColors[0].b, Alpha),
				IGraphics::CColorVertex(1, lQuads[j].m_aColors[1].r, lQuads[j].m_aColors[1].g, lQuads[j].m_aColors[1].b, Alpha),
				IGraphics::CColorVertex(2, lQuads[j].m_aColors[2].r, lQuads[j].m_aColors[2].g, lQuads[j].m_aColors[2].b, Alpha),
				IGraphics::CColorVertex(3, lQuads[j].m_aColors[3].r, lQuads[j].m_aColors[3].g, lQuads[j].m_aColors[3].b, Alpha)};
			Graphics()->SetColorVertex(aArray, 4);

			//Rotation
			if(Rot != 0)
			{
				static CPoint aRotated[4];
				aRotated[0] = lQuads[j].m_aPoints[0];
				aRotated[1] = lQuads[j].m_aPoints[1];
				aRotated[2] = lQuads[j].m_aPoints[2];
				aRotated[3] = lQuads[j].m_aPoints[3];
				pPoints = aRotated;

				Rotate(&lQuads[j].m_aPoints[4], &aRotated[0], Rot);
				Rotate(&lQuads[j].m_aPoints[4], &aRotated[1], Rot);
				Rotate(&lQuads[j].m_aPoints[4], &aRotated[2], Rot);
				Rotate(&lQuads[j].m_aPoints[4], &aRotated[3], Rot);
			}

			//Set Texture Coords
			Graphics()->QuadsSetSubsetFree(
				fx2f(lQuads[j].m_aTexcoords[0].x), fx2f(lQuads[j].m_aTexcoords[0].y),
				fx2f(lQuads[j].m_aTexcoords[1].x), fx2f(lQuads[j].m_aTexcoords[1].y),
				fx2f(lQuads[j].m_aTexcoords[2].x), fx2f(lQuads[j].m_aTexcoords[2].y),
				fx2f(lQuads[j].m_aTexcoords[3].x), fx2f(lQuads[j].m_aTexcoords[3].y)
			);

			//Set Quad Coords & Draw
			IGraphics::CFreeformItem Freeform(
				fx2f(pPoints[0].x)+OffsetX, fx2f(pPoints[0].y)+OffsetY,
				fx2f(pPoints[1].x)+OffsetX, fx2f(pPoints[1].y)+OffsetY,
				fx2f(pPoints[2].x)+OffsetX, fx2f(pPoints[2].y)+OffsetY,
				fx2f(pPoints[3].x)+OffsetX, fx2f(pPoints[3].y)+OffsetY);
			Graphics()->QuadsDrawFreeform(&Freeform, 1);
		}
	}
	Graphics()->QuadsEnd();
	Graphics()->TextureClear();
	Graphics()->QuadsBegin();

	// Draw QuadPoints
	for(int j = 0; j < Num; j++)
	{
		if(!apEnvelope[j])
			continue;

		for(int i = 0; i < apEnvelope[j]->m_lPoints.size(); i++)
			DoQuadEnvPoint(&lQuads[j], j, i);
	}
	Graphics()->QuadsEnd();
	delete[] apEnvelope;
}